

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O0

bool __thiscall
miniros::ServiceClient::call
          (ServiceClient *this,SerializedMessage *req,SerializedMessage *resp,string *service_md5sum
          )

{
  void *logger_handle;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  element_type *peVar5;
  undefined8 in_RSI;
  string *in_stack_00000008;
  string *in_stack_00000010;
  bool in_stack_0000001f;
  string *in_stack_00000020;
  ServiceManager *in_stack_00000028;
  M_string *in_stack_00000040;
  bool ret;
  ServiceServerLinkPtr link;
  bool enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  Level LVar6;
  M_string *__r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  double in_stack_fffffffffffffea8;
  LogLocation *in_stack_fffffffffffffeb0;
  bool local_13f;
  Level in_stack_fffffffffffffec4;
  string *in_stack_fffffffffffffec8;
  LogLocation *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  WallDuration local_ac;
  byte local_a1;
  undefined4 local_8c;
  __shared_ptr local_78 [19];
  undefined1 local_65;
  SerializedMessage *in_stack_ffffffffffffffa8;
  SerializedMessage *in_stack_ffffffffffffffb0;
  ServiceServerLink *in_stack_ffffffffffffffb8;
  bool local_9;
  
  std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4a3aad);
  bVar1 = std::operator!=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (bVar1) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    LVar6 = (Level)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if (((call::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (allocator<char> *)in_stack_fffffffffffffed0);
      console::initializeLogLocation
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    }
    if (call::loc.level_ != Error) {
      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffea0,LVar6);
      console::checkLogLocationEnabled(in_stack_fffffffffffffeb0);
    }
    logger_handle = call::loc.logger_;
    LVar6 = call::loc.level_;
    local_65 = (call::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_65) {
      std::
      __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3c31);
      uVar2 = std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::c_str();
      std::
      __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3c67);
      uVar4 = std::__cxx11::string::c_str();
      console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client.cpp"
                     ,0x71,
                     "bool miniros::ServiceClient::call(const SerializedMessage &, SerializedMessage &, const std::string &)"
                     ,
                     "Call to service [%s] with md5sum [%s] does not match md5sum when the handle was created ([%s])"
                     ,uVar2,uVar3,uVar4);
    }
    return false;
  }
  std::shared_ptr<miniros::ServiceServerLink>::shared_ptr
            ((shared_ptr<miniros::ServiceServerLink> *)0x4a3ce4);
  peVar5 = std::
           __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4a3cf1);
  if ((peVar5->persistent_ & 1U) == 0) {
    ServiceManager::instance();
    std::__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4a3e5b);
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3e6d);
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3e83);
    peVar5 = std::
             __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a3ea5);
    __r = &peVar5->header_values_;
    ServiceManager::createServiceServerLink
              (in_stack_00000028,in_stack_00000020,in_stack_0000001f,in_stack_00000010,
               in_stack_00000008,in_stack_00000040);
    std::shared_ptr<miniros::ServiceServerLink>::operator=
              ((shared_ptr<miniros::ServiceServerLink> *)in_stack_fffffffffffffea0,
               (shared_ptr<miniros::ServiceServerLink> *)__r);
    std::shared_ptr<miniros::ServiceServerLink>::~shared_ptr
              ((shared_ptr<miniros::ServiceServerLink> *)0x4a3efc);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
    if (!bVar1) {
      local_9 = false;
      goto LAB_004a401a;
    }
  }
  else {
    peVar5 = std::
             __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a3d08);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)peVar5);
    if (!bVar1) {
      ServiceManager::instance();
      std::__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3d2e);
      std::
      __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3d40);
      std::
      __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3d56);
      peVar5 = std::
               __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4a3d78);
      in_stack_fffffffffffffe98 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &peVar5->header_values_;
      ServiceManager::createServiceServerLink
                (in_stack_00000028,in_stack_00000020,in_stack_0000001f,in_stack_00000010,
                 in_stack_00000008,in_stack_00000040);
      std::
      __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3dba);
      std::shared_ptr<miniros::ServiceServerLink>::operator=
                ((shared_ptr<miniros::ServiceServerLink> *)in_stack_fffffffffffffea0,
                 (shared_ptr<miniros::ServiceServerLink> *)in_stack_fffffffffffffe98);
      std::shared_ptr<miniros::ServiceServerLink>::~shared_ptr
                ((shared_ptr<miniros::ServiceServerLink> *)0x4a3dd7);
      peVar5 = std::
               __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4a3de4);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)peVar5);
      if (!bVar1) {
        local_9 = false;
        goto LAB_004a401a;
      }
    }
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3e30);
    std::shared_ptr<miniros::ServiceServerLink>::operator=
              ((shared_ptr<miniros::ServiceServerLink> *)in_stack_fffffffffffffea0,
               (shared_ptr<miniros::ServiceServerLink> *)in_stack_fffffffffffffe98);
  }
  std::__shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4a3f34);
  local_a1 = ServiceServerLink::call
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_fffffffffffffeb0);
  while( true ) {
    bVar1 = isShuttingDown();
    local_13f = false;
    if (bVar1) {
      local_13f = ok();
    }
    if (local_13f == false) break;
    WallDuration::WallDuration((WallDuration *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    WallDuration::sleep(&local_ac,(uint)in_RSI);
    WallDuration::~WallDuration((WallDuration *)0x4a3fda);
  }
  local_9 = (bool)(local_a1 & 1);
LAB_004a401a:
  local_8c = 1;
  std::shared_ptr<miniros::ServiceServerLink>::~shared_ptr
            ((shared_ptr<miniros::ServiceServerLink> *)0x4a4027);
  return local_9;
}

Assistant:

bool ServiceClient::call(const SerializedMessage& req, SerializedMessage& resp, const std::string& service_md5sum)
{
  if (service_md5sum != impl_->service_md5sum_)
  {
    MINIROS_ERROR("Call to service [%s] with md5sum [%s] does not match md5sum when the handle was created ([%s])", impl_->name_.c_str(), service_md5sum.c_str(), impl_->service_md5sum_.c_str());

    return false;
  }

  ServiceServerLinkPtr link;

  if (impl_->persistent_)
  {
    if (!impl_->server_link_)
    {
      impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

      if (!impl_->server_link_)
      {
        return false;
      }
    }

    link = impl_->server_link_;
  }
  else
  {
    link = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

    if (!link)
    {
      return false;
    }
  }

  bool ret = link->call(req, resp);
  link.reset();

  // If we're shutting down but the node haven't finished yet, wait until we do
  while (miniros::isShuttingDown() && miniros::ok())
  {
    miniros::WallDuration(0.001).sleep();
  }

  return ret;
}